

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTestPropertyCommand.cxx
# Opt level: O3

bool __thiscall
cmGetTestPropertyCommand::InitialPass
          (cmGetTestPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pcVar2;
  cmTest *this_00;
  char *value;
  ulong uVar3;
  string testName;
  string var;
  string local_68;
  string local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (uVar3 < 0x41) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_002ae72d;
  }
  else {
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + pbVar1->_M_string_length);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = pbVar1[2]._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + pbVar1[2]._M_string_length);
    this_00 = cmMakefile::GetTest((this->super_cmCommand).Makefile,&local_68);
    if (((this_00 == (cmTest *)0x0) ||
        (pbVar1 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start, pbVar1[1]._M_string_length == 0)) ||
       (value = cmTest::GetProperty(this_00,pbVar1 + 1), value == (char *)0x0)) {
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_48,"NOTFOUND");
    }
    else {
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_48,value);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_002ae72d;
  }
  operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
LAB_002ae72d:
  return 0x40 < uVar3;
}

Assistant:

bool cmGetTestPropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 3 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string testName = args[0];
  std::string var = args[2];
  cmTest *test = this->Makefile->GetTest(testName);
  if (test)
    {
    const char *prop = 0;
    if (!args[1].empty())
      {
      prop = test->GetProperty(args[1]);
      }
    if (prop)
      {
      this->Makefile->AddDefinition(var, prop);
      return true;
      }
    }
  this->Makefile->AddDefinition(var, "NOTFOUND");
  return true;
}